

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_16781328,_false,_embree::sse42::VirtualCurveIntersectorK<4>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  byte bVar1;
  BVH *bvh;
  size_t sVar2;
  void *pvVar3;
  long lVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar11;
  undefined1 auVar12 [16];
  vfloat<4> vVar13;
  vbool<4> vVar14;
  char cVar15;
  bool bVar16;
  undefined4 in_EAX;
  uint uVar17;
  size_t mask;
  ulong uVar18;
  undefined4 uVar19;
  int iVar20;
  Intersectors *pIVar21;
  Intersectors *pIVar22;
  Intersectors *extraout_RDX;
  NodeRef root;
  Intersectors *pIVar23;
  Intersectors *pIVar24;
  NodeRef *pNVar25;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar26;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar27;
  ulong uVar28;
  bool bVar29;
  int iVar30;
  float fVar31;
  float fVar32;
  float fVar49;
  float fVar50;
  vint4 ai;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float fVar51;
  float fVar56;
  float fVar58;
  vint4 ai_3;
  undefined1 auVar53 [16];
  float fVar60;
  undefined1 auVar54 [16];
  float fVar52;
  float fVar57;
  float fVar59;
  undefined1 auVar55 [16];
  float fVar63;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  float fVar64;
  float fVar65;
  float fVar67;
  float fVar69;
  float fVar71;
  vint4 ai_1;
  float fVar68;
  float fVar70;
  float fVar72;
  float fVar73;
  undefined1 auVar66 [16];
  float fVar74;
  float fVar75;
  uint uVar76;
  float fVar80;
  float fVar82;
  vint4 ai_2;
  float fVar84;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  uint uVar81;
  uint uVar83;
  uint uVar85;
  undefined1 auVar79 [16];
  float fVar86;
  float fVar87;
  float fVar88;
  vint4 bi;
  float fVar89;
  vint4 bi_3;
  undefined1 auVar90 [16];
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  vint4 bi_1;
  float fVar96;
  float fVar97;
  uint uVar98;
  uint uVar99;
  uint uVar100;
  vint4 bi_2;
  uint uVar101;
  vfloat4 a0;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  float fVar104;
  float fVar107;
  float fVar108;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar109 [16];
  vint4 bi_12;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar112;
  vint4 bi_9;
  float fVar113;
  float fVar114;
  float fVar115;
  vint4 ai_15;
  float fVar116;
  TravRayK<4,_false> *tray_00;
  float local_1938;
  float fStack_1934;
  float fStack_1930;
  float fStack_192c;
  vbool<4> terminated;
  vbool<4> valid_o;
  TravRayK<4,_false> tray;
  undefined8 local_17f8;
  undefined8 uStack_17f0;
  Precalculations pre;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  auVar55 = mm_lookupmask_ps._0_16_;
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    auVar61 = *(undefined1 (*) [16])(ray + 0x80);
    auVar53._0_4_ = -(uint)((valid_i->field_0).i[0] == -1 && 0.0 <= auVar61._0_4_);
    auVar53._4_4_ = -(uint)((valid_i->field_0).i[1] == -1 && 0.0 <= auVar61._4_4_);
    auVar53._8_4_ = -(uint)((valid_i->field_0).i[2] == -1 && 0.0 <= auVar61._8_4_);
    auVar53._12_4_ = -(uint)((valid_i->field_0).i[3] == -1 && 0.0 <= auVar61._12_4_);
    uVar17 = movmskps(in_EAX,auVar53);
    if (uVar17 != 0) {
      uVar18 = (ulong)(uVar17 & 0xff);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      fVar75 = tray.dir.field_0._0_4_;
      fVar80 = tray.dir.field_0._4_4_;
      fVar82 = tray.dir.field_0._8_4_;
      fVar84 = tray.dir.field_0._12_4_;
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      fVar51 = tray.dir.field_0._16_4_;
      fVar56 = tray.dir.field_0._20_4_;
      fVar58 = tray.dir.field_0._24_4_;
      fVar60 = tray.dir.field_0._28_4_;
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      fVar65 = tray.dir.field_0._32_4_;
      fVar67 = tray.dir.field_0._36_4_;
      fVar69 = tray.dir.field_0._40_4_;
      fVar72 = tray.dir.field_0._44_4_;
      auVar90._0_4_ = fVar51 * fVar51 + fVar65 * fVar65;
      auVar90._4_4_ = fVar56 * fVar56 + fVar67 * fVar67;
      auVar90._8_4_ = fVar58 * fVar58 + fVar69 * fVar69;
      auVar90._12_4_ = fVar60 * fVar60 + fVar72 * fVar72;
      auVar102._0_4_ = fVar75 * fVar75 + auVar90._0_4_;
      auVar102._4_4_ = fVar80 * fVar80 + auVar90._4_4_;
      auVar102._8_4_ = fVar82 * fVar82 + auVar90._8_4_;
      auVar102._12_4_ = fVar84 * fVar84 + auVar90._12_4_;
      auVar90 = rsqrtps(auVar90,auVar102);
      fVar89 = auVar90._0_4_;
      fVar31 = auVar90._4_4_;
      fVar32 = auVar90._8_4_;
      fVar49 = auVar90._12_4_;
      pre.depth_scale.field_0.v[0] = fVar89 * fVar89 * auVar102._0_4_ * -0.5 * fVar89 + fVar89 * 1.5
      ;
      pre.depth_scale.field_0.v[1] = fVar31 * fVar31 * auVar102._4_4_ * -0.5 * fVar31 + fVar31 * 1.5
      ;
      pre.depth_scale.field_0.v[2] = fVar32 * fVar32 * auVar102._8_4_ * -0.5 * fVar32 + fVar32 * 1.5
      ;
      pre.depth_scale.field_0.v[3] =
           fVar49 * fVar49 * auVar102._12_4_ * -0.5 * fVar49 + fVar49 * 1.5;
      do {
        lVar4 = 0;
        if (uVar18 != 0) {
          for (; (uVar18 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
          }
        }
        auVar102 = insertps(ZEXT416(*(uint *)(ray + lVar4 * 4 + 0x40)),
                            *(undefined4 *)(ray + lVar4 * 4 + 0x50),0x1c);
        auVar102 = insertps(auVar102,*(undefined4 *)(ray + lVar4 * 4 + 0x60),0x28);
        fVar89 = *(float *)((long)pre.ray_space + lVar4 * 4 + -0x10);
        auVar103._0_4_ = auVar102._0_4_ * fVar89;
        auVar103._4_4_ = auVar102._4_4_ * fVar89;
        auVar103._8_4_ = auVar102._8_4_ * fVar89;
        auVar103._12_4_ = auVar102._12_4_ * fVar89;
        uVar28 = CONCAT44(auVar103._4_4_,auVar103._4_4_);
        auVar33._0_8_ = uVar28 ^ 0x8000000080000000;
        auVar33._8_4_ = -auVar103._12_4_;
        auVar33._12_4_ = -auVar103._12_4_;
        auVar102 = blendps(auVar33,ZEXT816(0),0xe);
        auVar111._4_4_ = auVar102._0_4_;
        auVar111._0_4_ = auVar103._8_4_;
        auVar111._8_4_ = auVar102._4_4_;
        auVar111._12_4_ = 0;
        auVar110._4_4_ = auVar102._0_4_;
        auVar110._0_4_ = auVar103._8_4_;
        auVar110._8_4_ = auVar102._4_4_;
        auVar110._12_4_ = 0;
        auVar110 = dpps(auVar110 << 0x20,auVar111 << 0x20,0x7f);
        uVar28 = CONCAT44(auVar103._12_4_,auVar103._8_4_);
        auVar105._0_8_ = uVar28 ^ 0x8000000080000000;
        auVar105._8_4_ = -auVar103._8_4_;
        auVar105._12_4_ = -auVar103._12_4_;
        auVar90 = insertps(auVar105,auVar103,0x2a);
        auVar102 = dpps(auVar90,auVar90,0x7f);
        iVar30 = -(uint)(auVar102._0_4_ < auVar110._0_4_);
        auVar34._4_4_ = iVar30;
        auVar34._0_4_ = iVar30;
        auVar34._8_4_ = iVar30;
        auVar34._12_4_ = iVar30;
        auVar102 = blendvps(auVar90,auVar111 << 0x20,auVar34);
        auVar90 = dpps(auVar102,auVar102,0x7f);
        auVar111 = rsqrtss(auVar90,auVar90);
        fVar31 = auVar111._0_4_;
        fVar31 = fVar31 * 1.5 - fVar31 * fVar31 * auVar90._0_4_ * 0.5 * fVar31;
        fVar32 = fVar31 * auVar102._0_4_;
        fVar49 = fVar31 * auVar102._4_4_;
        fVar50 = fVar31 * auVar102._8_4_;
        fVar31 = fVar31 * auVar102._12_4_;
        fVar104 = fVar49 * auVar103._0_4_ - auVar103._4_4_ * fVar32;
        fVar107 = fVar50 * auVar103._4_4_ - auVar103._8_4_ * fVar49;
        fVar108 = fVar32 * auVar103._8_4_ - auVar103._0_4_ * fVar50;
        auVar106._12_4_ = fVar31 * auVar103._12_4_ - auVar103._12_4_ * fVar31;
        auVar106._0_8_ = CONCAT44(fVar108,fVar107);
        auVar106._8_4_ = fVar104;
        auVar109._8_4_ = fVar104;
        auVar109._0_8_ = auVar106._0_8_;
        auVar109._12_4_ = auVar106._12_4_;
        auVar102 = dpps(auVar109,auVar106,0x7f);
        pIVar23 = (Intersectors *)(uVar18 - 1);
        pIVar21 = (Intersectors *)(lVar4 * 0x30);
        auVar90 = rsqrtss(auVar102,auVar102);
        fVar31 = auVar90._0_4_;
        fVar31 = fVar31 * 1.5 - fVar31 * fVar31 * auVar102._0_4_ * 0.5 * fVar31;
        aVar35.m128[1] = fVar31 * fVar104;
        aVar35.m128[0] = fVar50;
        aVar35.m128[2] = auVar103._8_4_ * fVar89;
        aVar35.m128[3] = 0.0;
        pre.ray_space[lVar4].vx.field_0.m128[0] = fVar32;
        pre.ray_space[lVar4].vx.field_0.m128[1] = fVar31 * fVar107;
        pre.ray_space[lVar4].vx.field_0.m128[2] = auVar103._0_4_ * fVar89;
        pre.ray_space[lVar4].vx.field_0.m128[3] = 0.0;
        aVar11.m128[1] = fVar31 * fVar108;
        aVar11.m128[0] = fVar49;
        aVar11.m128[2] = auVar103._4_4_ * fVar89;
        aVar11.m128[3] = 0.0;
        pre.ray_space[lVar4].vy.field_0 = aVar11;
        pre.ray_space[lVar4].vz.field_0 = aVar35;
        uVar18 = uVar18 & (ulong)pIVar23;
      } while (uVar18 != 0);
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      fVar89 = (float)DAT_01ff1d40;
      fVar31 = DAT_01ff1d40._4_4_;
      fVar32 = DAT_01ff1d40._8_4_;
      fVar49 = DAT_01ff1d40._12_4_;
      auVar36._4_4_ = -(uint)(ABS(fVar80) < fVar31);
      auVar36._0_4_ = -(uint)(ABS(fVar75) < fVar89);
      auVar36._8_4_ = -(uint)(ABS(fVar82) < fVar32);
      auVar36._12_4_ = -(uint)(ABS(fVar84) < fVar49);
      auVar110 = blendvps((undefined1  [16])tray.dir.field_0.field_0.x.field_0,_DAT_01ff1d40,auVar36
                         );
      auVar37._4_4_ = -(uint)(ABS(fVar56) < fVar31);
      auVar37._0_4_ = -(uint)(ABS(fVar51) < fVar89);
      auVar37._8_4_ = -(uint)(ABS(fVar58) < fVar32);
      auVar37._12_4_ = -(uint)(ABS(fVar60) < fVar49);
      auVar90 = blendvps((undefined1  [16])tray.dir.field_0.field_0.y.field_0,_DAT_01ff1d40,auVar37)
      ;
      auVar38._4_4_ = -(uint)(ABS(fVar67) < fVar31);
      auVar38._0_4_ = -(uint)(ABS(fVar65) < fVar89);
      auVar38._8_4_ = -(uint)(ABS(fVar69) < fVar32);
      auVar38._12_4_ = -(uint)(ABS(fVar72) < fVar49);
      auVar111 = blendvps((undefined1  [16])tray.dir.field_0.field_0.z.field_0,_DAT_01ff1d40,auVar38
                         );
      auVar102 = rcpps(auVar38,auVar110);
      fVar51 = auVar102._0_4_;
      auVar77._0_4_ = auVar110._0_4_ * fVar51;
      fVar56 = auVar102._4_4_;
      auVar77._4_4_ = auVar110._4_4_ * fVar56;
      fVar58 = auVar102._8_4_;
      auVar77._8_4_ = auVar110._8_4_ * fVar58;
      fVar60 = auVar102._12_4_;
      auVar77._12_4_ = auVar110._12_4_ * fVar60;
      tray.rdir.field_0._0_4_ = (1.0 - auVar77._0_4_) * fVar51 + fVar51;
      tray.rdir.field_0._4_4_ = (1.0 - auVar77._4_4_) * fVar56 + fVar56;
      tray.rdir.field_0._8_4_ = (1.0 - auVar77._8_4_) * fVar58 + fVar58;
      tray.rdir.field_0._12_4_ = (1.0 - auVar77._12_4_) * fVar60 + fVar60;
      auVar102 = rcpps(auVar77,auVar90);
      fVar51 = auVar102._0_4_;
      fVar56 = auVar102._4_4_;
      fVar58 = auVar102._8_4_;
      fVar60 = auVar102._12_4_;
      tray.rdir.field_0._16_4_ = (1.0 - auVar90._0_4_ * fVar51) * fVar51 + fVar51;
      tray.rdir.field_0._20_4_ = (1.0 - auVar90._4_4_ * fVar56) * fVar56 + fVar56;
      tray.rdir.field_0._24_4_ = (1.0 - auVar90._8_4_ * fVar58) * fVar58 + fVar58;
      tray.rdir.field_0._28_4_ = (1.0 - auVar90._12_4_ * fVar60) * fVar60 + fVar60;
      auVar102 = rcpps(auVar102,auVar111);
      fVar51 = auVar102._0_4_;
      fVar56 = auVar102._4_4_;
      fVar58 = auVar102._8_4_;
      fVar60 = auVar102._12_4_;
      tray.rdir.field_0._32_4_ = (1.0 - auVar111._0_4_ * fVar51) * fVar51 + fVar51;
      tray.rdir.field_0._36_4_ = (1.0 - auVar111._4_4_ * fVar56) * fVar56 + fVar56;
      tray.rdir.field_0._40_4_ = (1.0 - auVar111._8_4_ * fVar58) * fVar58 + fVar58;
      tray.rdir.field_0._44_4_ = (1.0 - auVar111._12_4_ * fVar60) * fVar60 + fVar60;
      auVar78._0_12_ = ZEXT812(0);
      auVar78._12_4_ = 0;
      tray.nearXYZ.field_0._0_4_ = -(uint)((float)tray.rdir.field_0._0_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._4_4_ = -(uint)((float)tray.rdir.field_0._4_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._8_4_ = -(uint)((float)tray.rdir.field_0._8_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._12_4_ = -(uint)((float)tray.rdir.field_0._12_4_ < 0.0) & 0x10;
      auVar39._4_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._20_4_);
      auVar39._0_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._16_4_);
      auVar39._8_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._24_4_);
      auVar39._12_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._28_4_);
      tray.nearXYZ.field_0.field_0.y.field_0 =
           (vint_impl<4>)blendvps(_DAT_0201fed0,_DAT_01ffd210,auVar39);
      auVar40._4_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._36_4_);
      auVar40._0_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._32_4_);
      auVar40._8_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._40_4_);
      auVar40._12_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._44_4_);
      tray.nearXYZ.field_0.field_0.z.field_0 =
           (vint_impl<4>)blendvps(_DAT_0201fef0,_DAT_0201fee0,auVar40);
      auVar102 = maxps(*(undefined1 (*) [16])(ray + 0x30),auVar78);
      auVar61 = maxps(auVar61,auVar78);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           blendvps((undefined1  [16])_DAT_01feb9f0,auVar102,auVar53);
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)blendvps(_DAT_01feba00,auVar61,auVar53);
      auVar61._8_4_ = 0xffffffff;
      auVar61._0_8_ = 0xffffffffffffffff;
      auVar61._12_4_ = 0xffffffff;
      terminated.field_0 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)(auVar61 ^ auVar53);
      if (context->user == (RTCRayQueryContext *)0x0) {
        pIVar24 = (Intersectors *)0x3;
      }
      else {
        pIVar24 = (Intersectors *)
                  ((ulong)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                          RTC_RAY_QUERY_FLAG_INCOHERENT) + 2);
      }
      pNVar25 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      stack_near[0].field_0 = _DAT_01feb9f0;
      stack_node[1].ptr = (bvh->root).ptr;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      iVar30 = 0x224ff80;
      paVar26 = &stack_near[2].field_0;
      aVar112 = _DAT_01feb9f0;
      do {
        paVar27 = paVar26 + -1;
        root.ptr = pNVar25[-1].ptr;
        pNVar25 = pNVar25 + -1;
        if (root.ptr == 0xfffffffffffffff8) {
LAB_002508fb:
          iVar30 = 3;
        }
        else {
          local_1938 = paVar27->v[0];
          fStack_1934 = *(float *)((long)paVar26 + -0xc);
          fStack_1930 = *(float *)((long)paVar26 + -8);
          fStack_192c = *(float *)((long)paVar26 + -4);
          vVar13.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar27->v;
          auVar41._4_4_ = -(uint)(fStack_1934 < tray.tfar.field_0.v[1]);
          auVar41._0_4_ = -(uint)(local_1938 < tray.tfar.field_0.v[0]);
          auVar41._8_4_ = -(uint)(fStack_1930 < tray.tfar.field_0.v[2]);
          auVar41._12_4_ = -(uint)(fStack_192c < tray.tfar.field_0.v[3]);
          uVar17 = movmskps(iVar30,auVar41);
          if (uVar17 == 0) {
            iVar30 = 2;
          }
          else {
            uVar18 = (ulong)(uVar17 & 0xff);
            pIVar22 = (Intersectors *)(ulong)(uint)POPCOUNT(uVar17 & 0xff);
            iVar30 = 0;
            if (pIVar22 <= pIVar24) {
              do {
                sVar2 = 0;
                if (uVar18 != 0) {
                  for (; (uVar18 >> sVar2 & 1) == 0; sVar2 = sVar2 + 1) {
                  }
                }
                tray_00 = &tray;
                pIVar23 = This;
                pIVar21 = (Intersectors *)context;
                bVar16 = occluded1(This,bvh,root,sVar2,&pre,ray,tray_00,context);
                if (bVar16) {
                  terminated.field_0.i[sVar2] = -1;
                }
                uVar18 = uVar18 & uVar18 - 1;
              } while (uVar18 != 0);
              iVar20 = movmskps((int)tray_00,(undefined1  [16])terminated.field_0);
              iVar30 = 3;
              local_1938 = vVar13.field_0._0_4_;
              fStack_1934 = vVar13.field_0._4_4_;
              fStack_1930 = vVar13.field_0._8_4_;
              fStack_192c = vVar13.field_0._12_4_;
              aVar112 = _DAT_01feb9f0;
              if (iVar20 != 0xf) {
                tray.tfar.field_0 =
                     (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     blendvps((undefined1  [16])tray.tfar.field_0,_DAT_01feba00,
                              (undefined1  [16])terminated.field_0);
                iVar30 = 2;
              }
            }
            vVar14.field_0 = terminated.field_0;
            if (pIVar24 < pIVar22) {
              do {
                if ((root.ptr & 8) != 0) {
                  if (root.ptr == 0xfffffffffffffff8) goto LAB_002508fb;
                  auVar48._4_4_ = -(uint)(fStack_1934 < tray.tfar.field_0.v[1]);
                  auVar48._0_4_ = -(uint)(local_1938 < tray.tfar.field_0.v[0]);
                  auVar48._8_4_ = -(uint)(fStack_1930 < tray.tfar.field_0.v[2]);
                  auVar48._12_4_ = -(uint)(fStack_192c < tray.tfar.field_0.v[3]);
                  iVar30 = movmskps(iVar30,auVar48);
                  if (iVar30 == 0) {
                    iVar30 = 2;
                    aVar112 = _DAT_01feb9f0;
                  }
                  else {
                    bVar1 = *(byte *)(root.ptr & 0xfffffffffffffff0);
                    uVar18 = (ulong)bVar1;
                    pvVar3 = This->leafIntersector;
                    local_17f8 = auVar55._0_8_;
                    uStack_17f0 = auVar55._8_8_;
                    valid_o.field_0._0_8_ = local_17f8;
                    valid_o.field_0._8_8_ = uStack_17f0;
                    uVar17 = movmskps((int)pIVar21,(undefined1  [16])terminated.field_0);
                    uVar17 = uVar17 ^ 0xf;
                    pIVar21 = (Intersectors *)(ulong)uVar17;
                    if (uVar17 != 0) {
                      uVar28 = (ulong)(byte)uVar17;
                      do {
                        lVar4 = 0;
                        if (uVar28 != 0) {
                          for (; (uVar28 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
                          }
                        }
                        pIVar23 = (Intersectors *)&pre;
                        cVar15 = (**(code **)((long)pvVar3 + (ulong)bVar1 * 0x40 + 0x18))
                                           (pIVar23,ray,lVar4,context,
                                            (byte *)(root.ptr & 0xfffffffffffffff0));
                        if (cVar15 != '\0') {
                          valid_o.field_0.i[lVar4] = -1;
                        }
                        uVar18 = uVar28 - 1;
                        uVar28 = uVar28 & uVar18;
                        pIVar21 = extraout_RDX;
                      } while (uVar28 != 0);
                    }
                    auVar12._8_8_ = valid_o.field_0._8_8_;
                    auVar12._0_8_ = valid_o.field_0._0_8_;
                    terminated.field_0 =
                         (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                         ((undefined1  [16])vVar14.field_0 | auVar12);
                    iVar30 = movmskps((int)uVar18,(undefined1  [16])terminated.field_0);
                    aVar112 = _DAT_01feb9f0;
                    if (iVar30 == 0xf) {
                      iVar30 = 3;
                    }
                    else {
                      tray.tfar.field_0 =
                           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                           blendvps((undefined1  [16])tray.tfar.field_0,_DAT_01feba00,
                                    (undefined1  [16])terminated.field_0);
                      iVar30 = 0;
                    }
                  }
                  break;
                }
                uVar18 = root.ptr & 0xfffffffffffffff0;
                uVar17 = (uint)root.ptr & 7;
                bVar16 = local_1938 < tray.tfar.field_0.v[0];
                bVar8 = fStack_1934 < tray.tfar.field_0.v[1];
                bVar9 = fStack_1930 < tray.tfar.field_0.v[2];
                bVar10 = fStack_192c < tray.tfar.field_0.v[3];
                local_1938 = aVar112.v[0];
                fStack_1934 = aVar112.v[1];
                fStack_1930 = aVar112.v[2];
                fStack_192c = aVar112.v[3];
                pIVar22 = (Intersectors *)0x0;
                root.ptr = 8;
                pIVar21 = pIVar23;
                do {
                  sVar2 = *(size_t *)(uVar18 + (long)pIVar22 * 8);
                  pIVar23 = pIVar21;
                  if (sVar2 != 8) {
                    if ((uVar17 == 6) || (uVar17 == 1)) {
                      fVar51 = *(float *)(uVar18 + 0x80 + (long)pIVar22 * 4);
                      fVar56 = *(float *)(uVar18 + 0x20 + (long)pIVar22 * 4);
                      fVar58 = *(float *)(uVar18 + 0x30 + (long)pIVar22 * 4);
                      fVar60 = *(float *)(uVar18 + 0x40 + (long)pIVar22 * 4);
                      fVar65 = *(float *)(uVar18 + 0x50 + (long)pIVar22 * 4);
                      auVar61 = *(undefined1 (*) [16])(ray + 0x70);
                      fVar49 = auVar61._0_4_;
                      fVar50 = auVar61._4_4_;
                      fVar104 = auVar61._8_4_;
                      fVar107 = auVar61._12_4_;
                      fVar67 = *(float *)(uVar18 + 0xa0 + (long)pIVar22 * 4);
                      fVar69 = *(float *)(uVar18 + 0xc0 + (long)pIVar22 * 4);
                      fVar72 = *(float *)(uVar18 + 0x60 + (long)pIVar22 * 4);
                      fVar75 = *(float *)(uVar18 + 0x90 + (long)pIVar22 * 4);
                      fVar80 = *(float *)(uVar18 + 0xb0 + (long)pIVar22 * 4);
                      fVar82 = *(float *)(uVar18 + 0xd0 + (long)pIVar22 * 4);
                      fVar84 = *(float *)(uVar18 + 0x70 + (long)pIVar22 * 4);
                      fVar89 = ((fVar51 * fVar49 + fVar56) - (float)tray.org.field_0._0_4_) *
                               (float)tray.rdir.field_0._0_4_;
                      fVar31 = ((fVar51 * fVar50 + fVar56) - (float)tray.org.field_0._4_4_) *
                               (float)tray.rdir.field_0._4_4_;
                      fVar32 = ((fVar51 * fVar104 + fVar56) - (float)tray.org.field_0._8_4_) *
                               (float)tray.rdir.field_0._8_4_;
                      fVar51 = ((fVar51 * fVar107 + fVar56) - (float)tray.org.field_0._12_4_) *
                               (float)tray.rdir.field_0._12_4_;
                      fVar108 = ((fVar67 * fVar49 + fVar60) - (float)tray.org.field_0._16_4_) *
                                (float)tray.rdir.field_0._16_4_;
                      fVar68 = ((fVar67 * fVar50 + fVar60) - (float)tray.org.field_0._20_4_) *
                               (float)tray.rdir.field_0._20_4_;
                      fVar70 = ((fVar67 * fVar104 + fVar60) - (float)tray.org.field_0._24_4_) *
                               (float)tray.rdir.field_0._24_4_;
                      fVar73 = ((fVar67 * fVar107 + fVar60) - (float)tray.org.field_0._28_4_) *
                               (float)tray.rdir.field_0._28_4_;
                      fVar56 = ((fVar69 * fVar49 + fVar72) - (float)tray.org.field_0._32_4_) *
                               (float)tray.rdir.field_0._32_4_;
                      fVar60 = ((fVar69 * fVar50 + fVar72) - (float)tray.org.field_0._36_4_) *
                               (float)tray.rdir.field_0._36_4_;
                      fVar67 = ((fVar69 * fVar104 + fVar72) - (float)tray.org.field_0._40_4_) *
                               (float)tray.rdir.field_0._40_4_;
                      fVar69 = ((fVar69 * fVar107 + fVar72) - (float)tray.org.field_0._44_4_) *
                               (float)tray.rdir.field_0._44_4_;
                      fVar72 = ((fVar75 * fVar49 + fVar58) - (float)tray.org.field_0._0_4_) *
                               (float)tray.rdir.field_0._0_4_;
                      fVar87 = ((fVar75 * fVar50 + fVar58) - (float)tray.org.field_0._4_4_) *
                               (float)tray.rdir.field_0._4_4_;
                      fVar88 = ((fVar75 * fVar104 + fVar58) - (float)tray.org.field_0._8_4_) *
                               (float)tray.rdir.field_0._8_4_;
                      fVar58 = ((fVar75 * fVar107 + fVar58) - (float)tray.org.field_0._12_4_) *
                               (float)tray.rdir.field_0._12_4_;
                      fVar91 = ((fVar80 * fVar49 + fVar65) - (float)tray.org.field_0._16_4_) *
                               (float)tray.rdir.field_0._16_4_;
                      fVar92 = ((fVar80 * fVar50 + fVar65) - (float)tray.org.field_0._20_4_) *
                               (float)tray.rdir.field_0._20_4_;
                      fVar94 = ((fVar80 * fVar104 + fVar65) - (float)tray.org.field_0._24_4_) *
                               (float)tray.rdir.field_0._24_4_;
                      fVar96 = ((fVar80 * fVar107 + fVar65) - (float)tray.org.field_0._28_4_) *
                               (float)tray.rdir.field_0._28_4_;
                      fVar65 = ((fVar82 * fVar49 + fVar84) - (float)tray.org.field_0._32_4_) *
                               (float)tray.rdir.field_0._32_4_;
                      fVar75 = ((fVar82 * fVar50 + fVar84) - (float)tray.org.field_0._36_4_) *
                               (float)tray.rdir.field_0._36_4_;
                      fVar80 = ((fVar82 * fVar104 + fVar84) - (float)tray.org.field_0._40_4_) *
                               (float)tray.rdir.field_0._40_4_;
                      fVar82 = ((fVar82 * fVar107 + fVar84) - (float)tray.org.field_0._44_4_) *
                               (float)tray.rdir.field_0._44_4_;
                      uVar76 = (uint)((int)fVar72 < (int)fVar89) * (int)fVar72 |
                               (uint)((int)fVar72 >= (int)fVar89) * (int)fVar89;
                      uVar81 = (uint)((int)fVar87 < (int)fVar31) * (int)fVar87 |
                               (uint)((int)fVar87 >= (int)fVar31) * (int)fVar31;
                      uVar83 = (uint)((int)fVar88 < (int)fVar32) * (int)fVar88 |
                               (uint)((int)fVar88 >= (int)fVar32) * (int)fVar32;
                      uVar85 = (uint)((int)fVar58 < (int)fVar51) * (int)fVar58 |
                               (uint)((int)fVar58 >= (int)fVar51) * (int)fVar51;
                      uVar98 = (uint)((int)fVar91 < (int)fVar108) * (int)fVar91 |
                               (uint)((int)fVar91 >= (int)fVar108) * (int)fVar108;
                      uVar99 = (uint)((int)fVar92 < (int)fVar68) * (int)fVar92 |
                               (uint)((int)fVar92 >= (int)fVar68) * (int)fVar68;
                      uVar100 = (uint)((int)fVar94 < (int)fVar70) * (int)fVar94 |
                                (uint)((int)fVar94 >= (int)fVar70) * (int)fVar70;
                      uVar101 = (uint)((int)fVar96 < (int)fVar73) * (int)fVar96 |
                                (uint)((int)fVar96 >= (int)fVar73) * (int)fVar73;
                      uVar98 = ((int)uVar98 < (int)uVar76) * uVar76 |
                               ((int)uVar98 >= (int)uVar76) * uVar98;
                      uVar99 = ((int)uVar99 < (int)uVar81) * uVar81 |
                               ((int)uVar99 >= (int)uVar81) * uVar99;
                      uVar100 = ((int)uVar100 < (int)uVar83) * uVar83 |
                                ((int)uVar100 >= (int)uVar83) * uVar100;
                      uVar101 = ((int)uVar101 < (int)uVar85) * uVar85 |
                                ((int)uVar101 >= (int)uVar85) * uVar101;
                      uVar76 = (uint)((int)fVar65 < (int)fVar56) * (int)fVar65 |
                               (uint)((int)fVar65 >= (int)fVar56) * (int)fVar56;
                      uVar81 = (uint)((int)fVar75 < (int)fVar60) * (int)fVar75 |
                               (uint)((int)fVar75 >= (int)fVar60) * (int)fVar60;
                      uVar83 = (uint)((int)fVar80 < (int)fVar67) * (int)fVar80 |
                               (uint)((int)fVar80 >= (int)fVar67) * (int)fVar67;
                      uVar85 = (uint)((int)fVar82 < (int)fVar69) * (int)fVar82 |
                               (uint)((int)fVar82 >= (int)fVar69) * (int)fVar69;
                      auVar79._0_4_ =
                           ((int)uVar76 < (int)uVar98) * uVar98 |
                           ((int)uVar76 >= (int)uVar98) * uVar76;
                      auVar79._4_4_ =
                           ((int)uVar81 < (int)uVar99) * uVar99 |
                           ((int)uVar81 >= (int)uVar99) * uVar81;
                      auVar79._8_4_ =
                           ((int)uVar83 < (int)uVar100) * uVar100 |
                           ((int)uVar83 >= (int)uVar100) * uVar83;
                      auVar79._12_4_ =
                           ((int)uVar85 < (int)uVar101) * uVar101 |
                           ((int)uVar85 >= (int)uVar101) * uVar85;
                      uVar76 = (uint)((int)fVar72 < (int)fVar89) * (int)fVar89 |
                               (uint)((int)fVar72 >= (int)fVar89) * (int)fVar72;
                      uVar81 = (uint)((int)fVar87 < (int)fVar31) * (int)fVar31 |
                               (uint)((int)fVar87 >= (int)fVar31) * (int)fVar87;
                      uVar83 = (uint)((int)fVar88 < (int)fVar32) * (int)fVar32 |
                               (uint)((int)fVar88 >= (int)fVar32) * (int)fVar88;
                      uVar85 = (uint)((int)fVar58 < (int)fVar51) * (int)fVar51 |
                               (uint)((int)fVar58 >= (int)fVar51) * (int)fVar58;
                      uVar98 = (uint)((int)fVar91 < (int)fVar108) * (int)fVar108 |
                               (uint)((int)fVar91 >= (int)fVar108) * (int)fVar91;
                      uVar99 = (uint)((int)fVar92 < (int)fVar68) * (int)fVar68 |
                               (uint)((int)fVar92 >= (int)fVar68) * (int)fVar92;
                      uVar100 = (uint)((int)fVar94 < (int)fVar70) * (int)fVar70 |
                                (uint)((int)fVar94 >= (int)fVar70) * (int)fVar94;
                      uVar101 = (uint)((int)fVar96 < (int)fVar73) * (int)fVar73 |
                                (uint)((int)fVar96 >= (int)fVar73) * (int)fVar96;
                      uVar98 = ((int)uVar76 < (int)uVar98) * uVar76 |
                               ((int)uVar76 >= (int)uVar98) * uVar98;
                      uVar99 = ((int)uVar81 < (int)uVar99) * uVar81 |
                               ((int)uVar81 >= (int)uVar99) * uVar99;
                      uVar100 = ((int)uVar83 < (int)uVar100) * uVar83 |
                                ((int)uVar83 >= (int)uVar100) * uVar100;
                      uVar101 = ((int)uVar85 < (int)uVar101) * uVar85 |
                                ((int)uVar85 >= (int)uVar101) * uVar101;
                      uVar76 = (uint)((int)fVar65 < (int)fVar56) * (int)fVar56 |
                               (uint)((int)fVar65 >= (int)fVar56) * (int)fVar65;
                      uVar81 = (uint)((int)fVar75 < (int)fVar60) * (int)fVar60 |
                               (uint)((int)fVar75 >= (int)fVar60) * (int)fVar75;
                      uVar83 = (uint)((int)fVar80 < (int)fVar67) * (int)fVar67 |
                               (uint)((int)fVar80 >= (int)fVar67) * (int)fVar80;
                      uVar85 = (uint)((int)fVar82 < (int)fVar69) * (int)fVar69 |
                               (uint)((int)fVar82 >= (int)fVar69) * (int)fVar82;
                      uVar76 = ((int)uVar98 < (int)uVar76) * uVar98 |
                               ((int)uVar98 >= (int)uVar76) * uVar76;
                      uVar81 = ((int)uVar99 < (int)uVar81) * uVar99 |
                               ((int)uVar99 >= (int)uVar81) * uVar81;
                      uVar83 = ((int)uVar100 < (int)uVar83) * uVar100 |
                               ((int)uVar100 >= (int)uVar83) * uVar83;
                      uVar85 = ((int)uVar101 < (int)uVar85) * uVar101 |
                               ((int)uVar101 >= (int)uVar85) * uVar85;
                      bVar29 = (float)((tray.tnear.field_0.i[0] < (int)auVar79._0_4_) *
                                       auVar79._0_4_ |
                                      (uint)(tray.tnear.field_0.i[0] >= (int)auVar79._0_4_) *
                                      tray.tnear.field_0.i[0]) <=
                               (float)((uint)(tray.tfar.field_0.i[0] < (int)uVar76) *
                                       tray.tfar.field_0.i[0] |
                                      (tray.tfar.field_0.i[0] >= (int)uVar76) * uVar76);
                      uVar76 = -(uint)bVar29;
                      bVar5 = (float)((tray.tnear.field_0.i[1] < (int)auVar79._4_4_) * auVar79._4_4_
                                     | (uint)(tray.tnear.field_0.i[1] >= (int)auVar79._4_4_) *
                                       tray.tnear.field_0.i[1]) <=
                              (float)((uint)(tray.tfar.field_0.i[1] < (int)uVar81) *
                                      tray.tfar.field_0.i[1] |
                                     (tray.tfar.field_0.i[1] >= (int)uVar81) * uVar81);
                      uVar81 = -(uint)bVar5;
                      bVar6 = (float)((tray.tnear.field_0.i[2] < (int)auVar79._8_4_) * auVar79._8_4_
                                     | (uint)(tray.tnear.field_0.i[2] >= (int)auVar79._8_4_) *
                                       tray.tnear.field_0.i[2]) <=
                              (float)((uint)(tray.tfar.field_0.i[2] < (int)uVar83) *
                                      tray.tfar.field_0.i[2] |
                                     (tray.tfar.field_0.i[2] >= (int)uVar83) * uVar83);
                      uVar83 = -(uint)bVar6;
                      bVar7 = (float)((tray.tnear.field_0.i[3] < (int)auVar79._12_4_) *
                                      auVar79._12_4_ |
                                     (uint)(tray.tnear.field_0.i[3] >= (int)auVar79._12_4_) *
                                     tray.tnear.field_0.i[3]) <=
                              (float)((uint)(tray.tfar.field_0.i[3] < (int)uVar85) *
                                      tray.tfar.field_0.i[3] |
                                     (tray.tfar.field_0.i[3] >= (int)uVar85) * uVar85);
                      uVar85 = -(uint)bVar7;
                      if (uVar17 == 6) {
                        fVar51 = *(float *)(uVar18 + 0xe0 + (long)pIVar22 * 4);
                        fVar56 = *(float *)(uVar18 + 0xf0 + (long)pIVar22 * 4);
                        uVar76 = -(uint)((fVar49 < fVar56 && fVar51 <= fVar49) && bVar29);
                        uVar81 = -(uint)((fVar50 < fVar56 && fVar51 <= fVar50) && bVar5);
                        uVar83 = -(uint)((fVar104 < fVar56 && fVar51 <= fVar104) && bVar6);
                        uVar85 = -(uint)((fVar107 < fVar56 && fVar51 <= fVar107) && bVar7);
                      }
                    }
                    else {
                      fVar51 = *(float *)(uVar18 + 0x20 + (long)pIVar22 * 4);
                      fVar56 = *(float *)(uVar18 + 0x30 + (long)pIVar22 * 4);
                      fVar58 = *(float *)(uVar18 + 0x40 + (long)pIVar22 * 4);
                      fVar60 = *(float *)(uVar18 + 0x50 + (long)pIVar22 * 4);
                      fVar65 = *(float *)(uVar18 + 0x60 + (long)pIVar22 * 4);
                      fVar67 = *(float *)(uVar18 + 0x70 + (long)pIVar22 * 4);
                      fVar69 = *(float *)(uVar18 + 0x80 + (long)pIVar22 * 4);
                      fVar72 = *(float *)(uVar18 + 0x90 + (long)pIVar22 * 4);
                      fVar75 = *(float *)(uVar18 + 0xa0 + (long)pIVar22 * 4);
                      fVar80 = *(float *)(uVar18 + 0xe0 + (long)pIVar22 * 4);
                      fVar82 = *(float *)(uVar18 + 0xf0 + (long)pIVar22 * 4);
                      auVar66._0_4_ =
                           fVar51 * (float)tray.dir.field_0._0_4_ +
                           fVar60 * (float)tray.dir.field_0._16_4_ +
                           fVar69 * (float)tray.dir.field_0._32_4_;
                      auVar66._4_4_ =
                           fVar51 * (float)tray.dir.field_0._4_4_ +
                           fVar60 * (float)tray.dir.field_0._20_4_ +
                           fVar69 * (float)tray.dir.field_0._36_4_;
                      auVar66._8_4_ =
                           fVar51 * (float)tray.dir.field_0._8_4_ +
                           fVar60 * (float)tray.dir.field_0._24_4_ +
                           fVar69 * (float)tray.dir.field_0._40_4_;
                      auVar66._12_4_ =
                           fVar51 * (float)tray.dir.field_0._12_4_ +
                           fVar60 * (float)tray.dir.field_0._28_4_ +
                           fVar69 * (float)tray.dir.field_0._44_4_;
                      auVar62._0_4_ =
                           fVar56 * (float)tray.dir.field_0._0_4_ +
                           fVar65 * (float)tray.dir.field_0._16_4_ +
                           fVar72 * (float)tray.dir.field_0._32_4_;
                      auVar62._4_4_ =
                           fVar56 * (float)tray.dir.field_0._4_4_ +
                           fVar65 * (float)tray.dir.field_0._20_4_ +
                           fVar72 * (float)tray.dir.field_0._36_4_;
                      auVar62._8_4_ =
                           fVar56 * (float)tray.dir.field_0._8_4_ +
                           fVar65 * (float)tray.dir.field_0._24_4_ +
                           fVar72 * (float)tray.dir.field_0._40_4_;
                      auVar62._12_4_ =
                           fVar56 * (float)tray.dir.field_0._12_4_ +
                           fVar65 * (float)tray.dir.field_0._28_4_ +
                           fVar72 * (float)tray.dir.field_0._44_4_;
                      fVar84 = *(float *)(uVar18 + 0x100 + (long)pIVar22 * 4);
                      auVar54._0_4_ =
                           (float)tray.dir.field_0._0_4_ * fVar58 +
                           (float)tray.dir.field_0._16_4_ * fVar67 +
                           (float)tray.dir.field_0._32_4_ * fVar75;
                      auVar54._4_4_ =
                           (float)tray.dir.field_0._4_4_ * fVar58 +
                           (float)tray.dir.field_0._20_4_ * fVar67 +
                           (float)tray.dir.field_0._36_4_ * fVar75;
                      auVar54._8_4_ =
                           (float)tray.dir.field_0._8_4_ * fVar58 +
                           (float)tray.dir.field_0._24_4_ * fVar67 +
                           (float)tray.dir.field_0._40_4_ * fVar75;
                      auVar54._12_4_ =
                           (float)tray.dir.field_0._12_4_ * fVar58 +
                           (float)tray.dir.field_0._28_4_ * fVar67 +
                           (float)tray.dir.field_0._44_4_ * fVar75;
                      fVar89 = (float)DAT_01ff1d40;
                      fVar31 = DAT_01ff1d40._4_4_;
                      fVar32 = DAT_01ff1d40._8_4_;
                      fVar49 = DAT_01ff1d40._12_4_;
                      auVar42._4_4_ = -(uint)(ABS(auVar66._4_4_) < fVar31);
                      auVar42._0_4_ = -(uint)(ABS(auVar66._0_4_) < fVar89);
                      auVar42._8_4_ = -(uint)(ABS(auVar66._8_4_) < fVar32);
                      auVar42._12_4_ = -(uint)(ABS(auVar66._12_4_) < fVar49);
                      auVar111 = blendvps(auVar66,_DAT_01ff1d40,auVar42);
                      auVar43._4_4_ = -(uint)(ABS(auVar62._4_4_) < fVar31);
                      auVar43._0_4_ = -(uint)(ABS(auVar62._0_4_) < fVar89);
                      auVar43._8_4_ = -(uint)(ABS(auVar62._8_4_) < fVar32);
                      auVar43._12_4_ = -(uint)(ABS(auVar62._12_4_) < fVar49);
                      auVar90 = blendvps(auVar62,_DAT_01ff1d40,auVar43);
                      auVar44._4_4_ = -(uint)(ABS(auVar54._4_4_) < fVar31);
                      auVar44._0_4_ = -(uint)(ABS(auVar54._0_4_) < fVar89);
                      auVar44._8_4_ = -(uint)(ABS(auVar54._8_4_) < fVar32);
                      auVar44._12_4_ = -(uint)(ABS(auVar54._12_4_) < fVar49);
                      auVar102 = blendvps(auVar54,_DAT_01ff1d40,auVar44);
                      fVar89 = *(float *)(uVar18 + 0x110 + (long)pIVar22 * 4);
                      fVar31 = *(float *)(uVar18 + 0x120 + (long)pIVar22 * 4);
                      fVar32 = *(float *)(uVar18 + 0x130 + (long)pIVar22 * 4);
                      fVar107 = *(float *)(ray + 0x70);
                      fVar108 = *(float *)(ray + 0x74);
                      fVar68 = *(float *)(ray + 0x78);
                      fVar70 = *(float *)(ray + 0x7c);
                      auVar45._0_4_ = 1.0 - fVar107;
                      auVar45._4_4_ = 1.0 - fVar108;
                      auVar45._8_4_ = 1.0 - fVar68;
                      auVar45._12_4_ = 1.0 - fVar70;
                      fVar113 = auVar45._0_4_ * 0.0;
                      fVar114 = auVar45._4_4_ * 0.0;
                      fVar115 = auVar45._8_4_ * 0.0;
                      fVar116 = auVar45._12_4_ * 0.0;
                      auVar61 = rcpps(auVar45,auVar111);
                      fVar73 = auVar61._0_4_;
                      fVar91 = auVar61._4_4_;
                      fVar96 = auVar61._8_4_;
                      fVar86 = auVar61._12_4_;
                      fVar73 = (1.0 - auVar111._0_4_ * fVar73) * fVar73 + fVar73;
                      fVar91 = (1.0 - auVar111._4_4_ * fVar91) * fVar91 + fVar91;
                      fVar96 = (1.0 - auVar111._8_4_ * fVar96) * fVar96 + fVar96;
                      fVar86 = (1.0 - auVar111._12_4_ * fVar86) * fVar86 + fVar86;
                      auVar61 = rcpps(auVar61,auVar90);
                      fVar87 = auVar61._0_4_;
                      fVar92 = auVar61._4_4_;
                      fVar71 = auVar61._8_4_;
                      fVar74 = auVar61._12_4_;
                      fVar87 = (1.0 - auVar90._0_4_ * fVar87) * fVar87 + fVar87;
                      fVar92 = (1.0 - auVar90._4_4_ * fVar92) * fVar92 + fVar92;
                      fVar71 = (1.0 - auVar90._8_4_ * fVar71) * fVar71 + fVar71;
                      fVar74 = (1.0 - auVar90._12_4_ * fVar74) * fVar74 + fVar74;
                      auVar61 = rcpps(auVar61,auVar102);
                      fVar88 = auVar61._0_4_;
                      fVar94 = auVar61._4_4_;
                      fVar63 = auVar61._8_4_;
                      fVar64 = auVar61._12_4_;
                      fVar88 = (1.0 - auVar102._0_4_ * fVar88) * fVar88 + fVar88;
                      fVar94 = (1.0 - auVar102._4_4_ * fVar94) * fVar94 + fVar94;
                      fVar63 = (1.0 - auVar102._8_4_ * fVar63) * fVar63 + fVar63;
                      fVar64 = (1.0 - auVar102._12_4_ * fVar64) * fVar64 + fVar64;
                      fVar49 = *(float *)(uVar18 + 0xb0 + (long)pIVar22 * 4);
                      fVar50 = *(float *)(uVar18 + 0xc0 + (long)pIVar22 * 4);
                      fVar104 = *(float *)(uVar18 + 0xd0 + (long)pIVar22 * 4);
                      fVar52 = fVar51 * (float)tray.org.field_0._0_4_ +
                               fVar60 * (float)tray.org.field_0._16_4_ +
                               fVar69 * (float)tray.org.field_0._32_4_ + fVar49;
                      fVar57 = fVar51 * (float)tray.org.field_0._4_4_ +
                               fVar60 * (float)tray.org.field_0._20_4_ +
                               fVar69 * (float)tray.org.field_0._36_4_ + fVar49;
                      fVar59 = fVar51 * (float)tray.org.field_0._8_4_ +
                               fVar60 * (float)tray.org.field_0._24_4_ +
                               fVar69 * (float)tray.org.field_0._40_4_ + fVar49;
                      fVar49 = fVar51 * (float)tray.org.field_0._12_4_ +
                               fVar60 * (float)tray.org.field_0._28_4_ +
                               fVar69 * (float)tray.org.field_0._44_4_ + fVar49;
                      fVar51 = fVar56 * (float)tray.org.field_0._0_4_ +
                               fVar65 * (float)tray.org.field_0._16_4_ +
                               fVar72 * (float)tray.org.field_0._32_4_ + fVar50;
                      fVar60 = fVar56 * (float)tray.org.field_0._4_4_ +
                               fVar65 * (float)tray.org.field_0._20_4_ +
                               fVar72 * (float)tray.org.field_0._36_4_ + fVar50;
                      fVar69 = fVar56 * (float)tray.org.field_0._8_4_ +
                               fVar65 * (float)tray.org.field_0._24_4_ +
                               fVar72 * (float)tray.org.field_0._40_4_ + fVar50;
                      fVar50 = fVar56 * (float)tray.org.field_0._12_4_ +
                               fVar65 * (float)tray.org.field_0._28_4_ +
                               fVar72 * (float)tray.org.field_0._44_4_ + fVar50;
                      fVar56 = fVar58 * (float)tray.org.field_0._0_4_ +
                               fVar67 * (float)tray.org.field_0._16_4_ +
                               fVar75 * (float)tray.org.field_0._32_4_ + fVar104;
                      fVar65 = fVar58 * (float)tray.org.field_0._4_4_ +
                               fVar67 * (float)tray.org.field_0._20_4_ +
                               fVar75 * (float)tray.org.field_0._36_4_ + fVar104;
                      fVar72 = fVar58 * (float)tray.org.field_0._8_4_ +
                               fVar67 * (float)tray.org.field_0._24_4_ +
                               fVar75 * (float)tray.org.field_0._40_4_ + fVar104;
                      fVar58 = fVar58 * (float)tray.org.field_0._12_4_ +
                               fVar67 * (float)tray.org.field_0._28_4_ +
                               fVar75 * (float)tray.org.field_0._44_4_ + fVar104;
                      fVar104 = ((fVar80 * fVar107 + fVar113) - fVar52) * fVar73;
                      fVar93 = ((fVar80 * fVar108 + fVar114) - fVar57) * fVar91;
                      fVar95 = ((fVar80 * fVar68 + fVar115) - fVar59) * fVar96;
                      fVar97 = ((fVar80 * fVar70 + fVar116) - fVar49) * fVar86;
                      fVar73 = ((fVar89 * fVar107 + auVar45._0_4_) - fVar52) * fVar73;
                      fVar91 = ((fVar89 * fVar108 + auVar45._4_4_) - fVar57) * fVar91;
                      fVar96 = ((fVar89 * fVar68 + auVar45._8_4_) - fVar59) * fVar96;
                      fVar86 = ((fVar89 * fVar70 + auVar45._12_4_) - fVar49) * fVar86;
                      fVar67 = ((fVar82 * fVar107 + fVar113) - fVar51) * fVar87;
                      fVar75 = ((fVar82 * fVar108 + fVar114) - fVar60) * fVar92;
                      fVar80 = ((fVar82 * fVar68 + fVar115) - fVar69) * fVar71;
                      fVar82 = ((fVar82 * fVar70 + fVar116) - fVar50) * fVar74;
                      fVar87 = ((fVar31 * fVar107 + auVar45._0_4_) - fVar51) * fVar87;
                      fVar92 = ((fVar31 * fVar108 + auVar45._4_4_) - fVar60) * fVar92;
                      fVar71 = ((fVar31 * fVar68 + auVar45._8_4_) - fVar69) * fVar71;
                      fVar74 = ((fVar31 * fVar70 + auVar45._12_4_) - fVar50) * fVar74;
                      fVar51 = ((fVar113 + fVar84 * fVar107) - fVar56) * fVar88;
                      fVar60 = ((fVar114 + fVar84 * fVar108) - fVar65) * fVar94;
                      fVar69 = ((fVar115 + fVar84 * fVar68) - fVar72) * fVar63;
                      fVar84 = ((fVar116 + fVar84 * fVar70) - fVar58) * fVar64;
                      fVar88 = ((fVar32 * fVar107 + auVar45._0_4_) - fVar56) * fVar88;
                      fVar94 = ((fVar32 * fVar108 + auVar45._4_4_) - fVar65) * fVar94;
                      fVar63 = ((fVar32 * fVar68 + auVar45._8_4_) - fVar72) * fVar63;
                      fVar64 = ((fVar32 * fVar70 + auVar45._12_4_) - fVar58) * fVar64;
                      uVar76 = (uint)((int)fVar73 < (int)fVar104) * (int)fVar73 |
                               (uint)((int)fVar73 >= (int)fVar104) * (int)fVar104;
                      uVar81 = (uint)((int)fVar91 < (int)fVar93) * (int)fVar91 |
                               (uint)((int)fVar91 >= (int)fVar93) * (int)fVar93;
                      uVar83 = (uint)((int)fVar96 < (int)fVar95) * (int)fVar96 |
                               (uint)((int)fVar96 >= (int)fVar95) * (int)fVar95;
                      uVar85 = (uint)((int)fVar86 < (int)fVar97) * (int)fVar86 |
                               (uint)((int)fVar86 >= (int)fVar97) * (int)fVar97;
                      uVar98 = (uint)((int)fVar87 < (int)fVar67) * (int)fVar87 |
                               (uint)((int)fVar87 >= (int)fVar67) * (int)fVar67;
                      uVar99 = (uint)((int)fVar92 < (int)fVar75) * (int)fVar92 |
                               (uint)((int)fVar92 >= (int)fVar75) * (int)fVar75;
                      uVar100 = (uint)((int)fVar71 < (int)fVar80) * (int)fVar71 |
                                (uint)((int)fVar71 >= (int)fVar80) * (int)fVar80;
                      uVar101 = (uint)((int)fVar74 < (int)fVar82) * (int)fVar74 |
                                (uint)((int)fVar74 >= (int)fVar82) * (int)fVar82;
                      uVar76 = ((int)uVar98 < (int)uVar76) * uVar76 |
                               ((int)uVar98 >= (int)uVar76) * uVar98;
                      uVar81 = ((int)uVar99 < (int)uVar81) * uVar81 |
                               ((int)uVar99 >= (int)uVar81) * uVar99;
                      uVar83 = ((int)uVar100 < (int)uVar83) * uVar83 |
                               ((int)uVar100 >= (int)uVar83) * uVar100;
                      uVar85 = ((int)uVar101 < (int)uVar85) * uVar85 |
                               ((int)uVar101 >= (int)uVar85) * uVar101;
                      uVar98 = (uint)((int)fVar88 < (int)fVar51) * (int)fVar88 |
                               (uint)((int)fVar88 >= (int)fVar51) * (int)fVar51;
                      uVar99 = (uint)((int)fVar94 < (int)fVar60) * (int)fVar94 |
                               (uint)((int)fVar94 >= (int)fVar60) * (int)fVar60;
                      uVar100 = (uint)((int)fVar63 < (int)fVar69) * (int)fVar63 |
                                (uint)((int)fVar63 >= (int)fVar69) * (int)fVar69;
                      uVar101 = (uint)((int)fVar64 < (int)fVar84) * (int)fVar64 |
                                (uint)((int)fVar64 >= (int)fVar84) * (int)fVar84;
                      auVar79._0_4_ =
                           ((int)uVar98 < (int)uVar76) * uVar76 |
                           ((int)uVar98 >= (int)uVar76) * uVar98;
                      auVar79._4_4_ =
                           ((int)uVar99 < (int)uVar81) * uVar81 |
                           ((int)uVar99 >= (int)uVar81) * uVar99;
                      auVar79._8_4_ =
                           ((int)uVar100 < (int)uVar83) * uVar83 |
                           ((int)uVar100 >= (int)uVar83) * uVar100;
                      auVar79._12_4_ =
                           ((int)uVar101 < (int)uVar85) * uVar85 |
                           ((int)uVar101 >= (int)uVar85) * uVar101;
                      uVar98 = (uint)((int)fVar73 < (int)fVar104) * (int)fVar104 |
                               (uint)((int)fVar73 >= (int)fVar104) * (int)fVar73;
                      uVar99 = (uint)((int)fVar91 < (int)fVar93) * (int)fVar93 |
                               (uint)((int)fVar91 >= (int)fVar93) * (int)fVar91;
                      uVar100 = (uint)((int)fVar96 < (int)fVar95) * (int)fVar95 |
                                (uint)((int)fVar96 >= (int)fVar95) * (int)fVar96;
                      uVar101 = (uint)((int)fVar86 < (int)fVar97) * (int)fVar97 |
                                (uint)((int)fVar86 >= (int)fVar97) * (int)fVar86;
                      uVar76 = (uint)((int)fVar87 < (int)fVar67) * (int)fVar67 |
                               (uint)((int)fVar87 >= (int)fVar67) * (int)fVar87;
                      uVar81 = (uint)((int)fVar92 < (int)fVar75) * (int)fVar75 |
                               (uint)((int)fVar92 >= (int)fVar75) * (int)fVar92;
                      uVar83 = (uint)((int)fVar71 < (int)fVar80) * (int)fVar80 |
                               (uint)((int)fVar71 >= (int)fVar80) * (int)fVar71;
                      uVar85 = (uint)((int)fVar74 < (int)fVar82) * (int)fVar82 |
                               (uint)((int)fVar74 >= (int)fVar82) * (int)fVar74;
                      uVar76 = ((int)uVar98 < (int)uVar76) * uVar98 |
                               ((int)uVar98 >= (int)uVar76) * uVar76;
                      uVar81 = ((int)uVar99 < (int)uVar81) * uVar99 |
                               ((int)uVar99 >= (int)uVar81) * uVar81;
                      uVar83 = ((int)uVar100 < (int)uVar83) * uVar100 |
                               ((int)uVar100 >= (int)uVar83) * uVar83;
                      uVar85 = ((int)uVar101 < (int)uVar85) * uVar101 |
                               ((int)uVar101 >= (int)uVar85) * uVar85;
                      uVar98 = (uint)((int)fVar88 < (int)fVar51) * (int)fVar51 |
                               (uint)((int)fVar88 >= (int)fVar51) * (int)fVar88;
                      uVar99 = (uint)((int)fVar94 < (int)fVar60) * (int)fVar60 |
                               (uint)((int)fVar94 >= (int)fVar60) * (int)fVar94;
                      uVar100 = (uint)((int)fVar63 < (int)fVar69) * (int)fVar69 |
                                (uint)((int)fVar63 >= (int)fVar69) * (int)fVar63;
                      uVar101 = (uint)((int)fVar64 < (int)fVar84) * (int)fVar84 |
                                (uint)((int)fVar64 >= (int)fVar84) * (int)fVar64;
                      uVar76 = ((int)uVar76 < (int)uVar98) * uVar76 |
                               ((int)uVar76 >= (int)uVar98) * uVar98;
                      uVar81 = ((int)uVar81 < (int)uVar99) * uVar81 |
                               ((int)uVar81 >= (int)uVar99) * uVar99;
                      uVar83 = ((int)uVar83 < (int)uVar100) * uVar83 |
                               ((int)uVar83 >= (int)uVar100) * uVar100;
                      uVar85 = ((int)uVar85 < (int)uVar101) * uVar85 |
                               ((int)uVar85 >= (int)uVar101) * uVar101;
                      uVar76 = -(uint)((float)((tray.tnear.field_0.i[0] < (int)auVar79._0_4_) *
                                               auVar79._0_4_ |
                                              (uint)(tray.tnear.field_0.i[0] >= (int)auVar79._0_4_)
                                              * tray.tnear.field_0.i[0]) <=
                                      (float)((uint)(tray.tfar.field_0.i[0] < (int)uVar76) *
                                              tray.tfar.field_0.i[0] |
                                             (tray.tfar.field_0.i[0] >= (int)uVar76) * uVar76));
                      uVar81 = -(uint)((float)((tray.tnear.field_0.i[1] < (int)auVar79._4_4_) *
                                               auVar79._4_4_ |
                                              (uint)(tray.tnear.field_0.i[1] >= (int)auVar79._4_4_)
                                              * tray.tnear.field_0.i[1]) <=
                                      (float)((uint)(tray.tfar.field_0.i[1] < (int)uVar81) *
                                              tray.tfar.field_0.i[1] |
                                             (tray.tfar.field_0.i[1] >= (int)uVar81) * uVar81));
                      uVar83 = -(uint)((float)((tray.tnear.field_0.i[2] < (int)auVar79._8_4_) *
                                               auVar79._8_4_ |
                                              (uint)(tray.tnear.field_0.i[2] >= (int)auVar79._8_4_)
                                              * tray.tnear.field_0.i[2]) <=
                                      (float)((uint)(tray.tfar.field_0.i[2] < (int)uVar83) *
                                              tray.tfar.field_0.i[2] |
                                             (tray.tfar.field_0.i[2] >= (int)uVar83) * uVar83));
                      uVar85 = -(uint)((float)((tray.tnear.field_0.i[3] < (int)auVar79._12_4_) *
                                               auVar79._12_4_ |
                                              (uint)(tray.tnear.field_0.i[3] >= (int)auVar79._12_4_)
                                              * tray.tnear.field_0.i[3]) <=
                                      (float)((uint)(tray.tfar.field_0.i[3] < (int)uVar85) *
                                              tray.tfar.field_0.i[3] |
                                             (tray.tfar.field_0.i[3] >= (int)uVar85) * uVar85));
                      aVar112 = _DAT_01feb9f0;
                    }
                    auVar46._0_4_ = (uVar76 & -(uint)bVar16) << 0x1f;
                    auVar46._4_4_ = (uVar81 & -(uint)bVar8) << 0x1f;
                    auVar46._8_4_ = (uVar83 & -(uint)bVar9) << 0x1f;
                    auVar46._12_4_ = (uVar85 & -(uint)bVar10) << 0x1f;
                    uVar76 = movmskps((int)pIVar21,auVar46);
                    pIVar23 = (Intersectors *)(ulong)uVar76;
                    if (uVar76 != 0) {
                      auVar61 = blendvps((undefined1  [16])aVar112,auVar79,auVar46);
                      if (root.ptr != 8) {
                        pNVar25->ptr = root.ptr;
                        pNVar25 = pNVar25 + 1;
                        paVar27->v[0] = local_1938;
                        paVar27->v[1] = fStack_1934;
                        paVar27->v[2] = fStack_1930;
                        paVar27->v[3] = fStack_192c;
                        paVar27 = paVar27 + 1;
                      }
                      local_1938 = auVar61._0_4_;
                      fStack_1934 = auVar61._4_4_;
                      fStack_1930 = auVar61._8_4_;
                      fStack_192c = auVar61._12_4_;
                      root.ptr = sVar2;
                    }
                  }
                  pIVar21 = pIVar22;
                } while ((sVar2 != 8) &&
                        (pIVar21 = (Intersectors *)
                                   ((long)(((vfloat<4> *)&pIVar22->ptr)->field_0).v + 1),
                        bVar29 = pIVar22 < (Intersectors *)0x3, pIVar22 = pIVar21, pIVar23 = pIVar21
                        , bVar29));
                iVar30 = 0;
                if (root.ptr == 8) {
LAB_002507f4:
                  bVar16 = false;
                  iVar30 = 4;
                }
                else {
                  auVar47._4_4_ = -(uint)(fStack_1934 < tray.tfar.field_0.v[1]);
                  auVar47._0_4_ = -(uint)(local_1938 < tray.tfar.field_0.v[0]);
                  auVar47._8_4_ = -(uint)(fStack_1930 < tray.tfar.field_0.v[2]);
                  auVar47._12_4_ = -(uint)(fStack_192c < tray.tfar.field_0.v[3]);
                  uVar19 = movmskps(uVar17,auVar47);
                  pIVar21 = (Intersectors *)(ulong)(uint)POPCOUNT(uVar19);
                  bVar16 = true;
                  if (pIVar21 <= pIVar24) {
                    pNVar25->ptr = root.ptr;
                    pNVar25 = pNVar25 + 1;
                    paVar27->v[0] = local_1938;
                    paVar27->v[1] = fStack_1934;
                    paVar27->v[2] = fStack_1930;
                    paVar27->v[3] = fStack_192c;
                    paVar27 = paVar27 + 1;
                    goto LAB_002507f4;
                  }
                }
              } while (bVar16);
            }
          }
        }
        paVar26 = paVar27;
      } while (iVar30 != 3);
      auVar55._0_4_ = auVar53._0_4_ & terminated.field_0.i[0];
      auVar55._4_4_ = auVar53._4_4_ & terminated.field_0.i[1];
      auVar55._8_4_ = auVar53._8_4_ & terminated.field_0.i[2];
      auVar55._12_4_ = auVar53._12_4_ & terminated.field_0.i[3];
      auVar55 = blendvps(*(undefined1 (*) [16])(ray + 0x80),_DAT_01feba00,auVar55);
      *(undefined1 (*) [16])(ray + 0x80) = auVar55;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }